

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O3

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::cbtAxisSweep3Internal
          (cbtAxisSweep3Internal<unsigned_short> *this,cbtVector3 *worldAabbMin,
          cbtVector3 *worldAabbMax,unsigned_short handleMask,unsigned_short handleSentinel,
          unsigned_short userMaxHandles,cbtOverlappingPairCache *pairCache,
          bool disableRaycastAccelerator)

{
  Edge *pEVar1;
  undefined1 auVar2 [32];
  undefined8 uVar3;
  ulong uVar4;
  cbtHashedOverlappingPairCache *this_00;
  cbtOverlappingPairCache *pcVar5;
  cbtDbvtBroadphase *this_01;
  Handle *pHVar6;
  void *pvVar7;
  ulong uVar8;
  Handle *pHVar9;
  ushort uVar10;
  uint uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [12];
  undefined1 in_ZMM1 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_ZMM9 [64];
  
  auVar30 = in_ZMM1._4_12_;
  uVar10 = userMaxHandles + 1;
  (this->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface =
       (_func_int **)&PTR__cbtAxisSweep3Internal_00b471e8;
  this->m_bpHandleMask = handleMask;
  this->m_handleSentinel = handleSentinel;
  this->m_pairCache = pairCache;
  this->m_userPairCallback = (cbtOverlappingPairCallback *)0x0;
  this->m_ownsPairCache = false;
  this->m_invalidPair = 0;
  this->m_raycastAccelerator = (cbtDbvtBroadphase *)0x0;
  if (pairCache == (cbtOverlappingPairCache *)0x0) {
    this_00 = (cbtHashedOverlappingPairCache *)cbtAlignedAllocInternal(0x78,0x10);
    cbtHashedOverlappingPairCache::cbtHashedOverlappingPairCache(this_00);
    this->m_pairCache = (cbtOverlappingPairCache *)this_00;
    this->m_ownsPairCache = true;
  }
  auVar13 = in_ZMM9._0_16_;
  if (!disableRaycastAccelerator) {
    pcVar5 = (cbtOverlappingPairCache *)cbtAlignedAllocInternal(0x28,0x10);
    pcVar5[1].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar5[2].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar5[3].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar5[4].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    (pcVar5->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback =
         (_func_int **)&PTR__cbtNullPairCache_00b47268;
    *(undefined1 *)&pcVar5[4].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = 1;
    *(undefined4 *)
     ((long)&pcVar5[1].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback + 4) = 0;
    this->m_nullPairCache = pcVar5;
    in_ZMM9 = ZEXT1664(auVar13);
    this_01 = (cbtDbvtBroadphase *)cbtAlignedAllocInternal(0x100,0x10);
    cbtDbvtBroadphase::cbtDbvtBroadphase(this_01,this->m_nullPairCache);
    this->m_raycastAccelerator = this_01;
    this_01->m_deferedcollide = true;
  }
  uVar3 = *(undefined8 *)(worldAabbMin->m_floats + 2);
  *(undefined8 *)(this->m_worldAabbMin).m_floats = *(undefined8 *)worldAabbMin->m_floats;
  *(undefined8 *)((this->m_worldAabbMin).m_floats + 2) = uVar3;
  uVar3 = *(undefined8 *)(worldAabbMax->m_floats + 2);
  uVar11 = (uint)uVar10;
  *(undefined8 *)(this->m_worldAabbMax).m_floats = *(undefined8 *)worldAabbMax->m_floats;
  *(undefined8 *)((this->m_worldAabbMax).m_floats + 2) = uVar3;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(this->m_worldAabbMin).m_floats;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(this->m_worldAabbMax).m_floats;
  auVar13 = vsubps_avx(auVar31,auVar13);
  fVar29 = (float)this->m_handleSentinel;
  auVar32._4_4_ = fVar29;
  auVar32._0_4_ = fVar29;
  auVar32._8_4_ = fVar29;
  auVar32._12_4_ = fVar29;
  auVar28._0_4_ = fVar29 / ((this->m_worldAabbMax).m_floats[2] - (this->m_worldAabbMin).m_floats[2])
  ;
  auVar28._4_12_ = auVar30;
  auVar13 = vdivps_avx(auVar32,auVar13);
  auVar13 = vinsertps_avx(auVar13,auVar28,0x28);
  *(undefined1 (*) [16])(this->m_quantize).m_floats = auVar13;
  pHVar6 = (Handle *)cbtAlignedAllocInternal((ulong)(uVar11 * 8) * 9,0x10);
  if (uVar10 == 0) {
    this->m_pHandles = pHVar6;
    this->m_maxHandles = 0;
    this->m_numHandles = 0;
    this->m_firstFreeHandle = 1;
  }
  else {
    auVar2 = vpmovsxwd_avx2(_DAT_009eba70);
    uVar8 = 0;
    auVar14 = vpbroadcastq_avx512f();
    auVar14 = vpsrlq_avx512f(auVar14,6);
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    pHVar9 = pHVar6;
    do {
      auVar16 = vpbroadcastq_avx512f();
      uVar8 = uVar8 + 8;
      auVar16 = vporq_avx512f(auVar16,auVar15);
      uVar3 = vpcmpuq_avx512f(auVar16,auVar14,2);
      vpscatterdq_avx512f(ZEXT864(pHVar9) + ZEXT3264(auVar2),uVar3,ZEXT1664(ZEXT816(0) << 0x40));
      pHVar9 = pHVar9 + 8;
    } while ((((ulong)uVar11 * 0x48 - 0x48) / 0x48 + 8 & 0xfffffffffffffff8) != uVar8);
    this->m_pHandles = pHVar6;
    this->m_maxHandles = uVar10;
    this->m_numHandles = 0;
    this->m_firstFreeHandle = 1;
    if (userMaxHandles != 0) {
      auVar14 = vpmovsxbq_avx512f(ZEXT816(0x201f1e1d1c1b1a19));
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0x1817161514131211));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x100f0e0d0c0b0a09));
      auVar18 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar22 = vpbroadcastq_avx512f(ZEXT816(0x20));
      auVar23 = vpternlogd_avx512f(in_ZMM9,in_ZMM9,in_ZMM9,0xff);
      uVar8 = 0;
      auVar24 = vpbroadcastq_avx512f();
      do {
        auVar25 = vpbroadcastq_avx512f();
        auVar26 = vporq_avx512f(auVar25,auVar15);
        uVar4 = vpcmpuq_avx512f(auVar26,auVar24,2);
        auVar26 = vpsubq_avx512f(auVar18,auVar23);
        if ((uVar4 & 1) != 0) {
          vpextrw_avx(auVar26._0_16_,0);
        }
        if ((uVar4 & 2) != 0) {
          vpextrw_avx(auVar26._0_16_,4);
        }
        if ((uVar4 & 4) != 0) {
          vpextrw_avx(auVar26._16_16_,0);
        }
        if ((uVar4 & 8) != 0) {
          vpextrw_avx(auVar26._16_16_,4);
        }
        auVar13 = vextracti32x4_avx512f(auVar26,2);
        if ((uVar4 & 0x10) != 0) {
          vpextrw_avx(auVar13,0);
        }
        if ((uVar4 & 0x20) != 0) {
          vpextrw_avx(auVar13,4);
        }
        auVar13 = vextracti32x4_avx512f(auVar26,3);
        if ((uVar4 & 0x40) != 0) {
          vpextrw_avx(auVar13,0);
        }
        if ((uVar4 & 0x80) != 0) {
          vpextrw_avx(auVar13,4);
        }
        auVar26 = vporq_avx512f(auVar25,auVar21);
        auVar27 = vpsubq_avx512f(auVar17,auVar23);
        uVar4 = vpcmpuq_avx512f(auVar26,auVar24,2);
        if ((uVar4 & 1) != 0) {
          vpextrw_avx(auVar27._0_16_,0);
        }
        if ((uVar4 & 2) != 0) {
          vpextrw_avx(auVar27._0_16_,4);
        }
        if ((uVar4 & 4) != 0) {
          vpextrw_avx(auVar27._16_16_,0);
        }
        if ((uVar4 & 8) != 0) {
          vpextrw_avx(auVar27._16_16_,4);
        }
        auVar13 = vextracti32x4_avx512f(auVar27,2);
        if ((uVar4 & 0x10) != 0) {
          vpextrw_avx(auVar13,0);
        }
        if ((uVar4 & 0x20) != 0) {
          vpextrw_avx(auVar13,4);
        }
        auVar13 = vextracti32x4_avx512f(auVar27,3);
        if ((uVar4 & 0x40) != 0) {
          vpextrw_avx(auVar13,0);
        }
        if ((uVar4 & 0x80) != 0) {
          vpextrw_avx(auVar13,4);
        }
        auVar26 = vporq_avx512f(auVar25,auVar20);
        auVar27 = vpsubq_avx512f(auVar16,auVar23);
        uVar4 = vpcmpuq_avx512f(auVar26,auVar24,2);
        if ((uVar4 & 1) != 0) {
          vpextrw_avx(auVar27._0_16_,0);
        }
        if ((uVar4 & 2) != 0) {
          vpextrw_avx(auVar27._0_16_,4);
        }
        if ((uVar4 & 4) != 0) {
          vpextrw_avx(auVar27._16_16_,0);
        }
        if ((uVar4 & 8) != 0) {
          vpextrw_avx(auVar27._16_16_,4);
        }
        auVar13 = vextracti32x4_avx512f(auVar27,2);
        if ((uVar4 & 0x10) != 0) {
          vpextrw_avx(auVar13,0);
        }
        if ((uVar4 & 0x20) != 0) {
          vpextrw_avx(auVar13,4);
        }
        auVar13 = vextracti32x4_avx512f(auVar27,3);
        if ((uVar4 & 0x40) != 0) {
          vpextrw_avx(auVar13,0);
        }
        if ((uVar4 & 0x80) != 0) {
          vpextrw_avx(auVar13,4);
        }
        auVar25 = vporq_avx512f(auVar25,auVar19);
        auVar26 = vpsubq_avx512f(auVar14,auVar23);
        uVar4 = vpcmpuq_avx512f(auVar25,auVar24,2);
        if ((uVar4 & 1) != 0) {
          vpextrw_avx(auVar26._0_16_,0);
        }
        if ((uVar4 & 2) != 0) {
          vpextrw_avx(auVar26._0_16_,4);
        }
        if ((uVar4 & 4) != 0) {
          vpextrw_avx(auVar26._16_16_,0);
        }
        if ((uVar4 & 8) != 0) {
          vpextrw_avx(auVar26._16_16_,4);
        }
        auVar13 = vextracti32x4_avx512f(auVar26,2);
        if ((uVar4 & 0x10) != 0) {
          vpextrw_avx(auVar13,0);
        }
        if ((uVar4 & 0x20) != 0) {
          vpextrw_avx(auVar13,4);
        }
        auVar13 = vextracti32x4_avx512f(auVar26,3);
        if ((uVar4 & 0x40) != 0) {
          vpextrw_avx(auVar13,0);
        }
        if ((uVar4 & 0x80) != 0) {
          vpextrw_avx(auVar13,4);
        }
        uVar8 = uVar8 + 0x20;
        auVar18 = vpaddq_avx512f(auVar18,auVar22);
        auVar17 = vpaddq_avx512f(auVar17,auVar22);
        auVar16 = vpaddq_avx512f(auVar16,auVar22);
        auVar14 = vpaddq_avx512f(auVar14,auVar22);
      } while ((uVar11 + 0x1e & 0xffffffe0) != uVar8);
    }
  }
  lVar12 = -3;
  *(undefined2 *)&pHVar6[(ulong)uVar11 - 1].super_cbtBroadphaseProxy.field_0x34 = 0;
  do {
    pvVar7 = cbtAlignedAllocInternal((ulong)(uVar11 * 8),0x10);
    this->m_pEdgesRawPtr[lVar12 + 3] = pvVar7;
    this->m_pEdgesRawPtr[lVar12] = pvVar7;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0);
  pHVar6 = this->m_pHandles;
  lVar12 = 0;
  (pHVar6->super_cbtBroadphaseProxy).m_clientObject = (void *)0x0;
  do {
    pHVar6->m_maxEdges[lVar12 + -3] = 0;
    pHVar6->m_maxEdges[lVar12] = 1;
    pEVar1 = this->m_pEdges[lVar12];
    lVar12 = lVar12 + 1;
    pEVar1->m_pos = 0;
    pEVar1->m_handle = 0;
    pEVar1[1].m_pos = this->m_handleSentinel;
    pEVar1[1].m_handle = 0;
  } while (lVar12 != 3);
  return;
}

Assistant:

cbtAxisSweep3Internal<BP_FP_INT_TYPE>::cbtAxisSweep3Internal(const cbtVector3& worldAabbMin, const cbtVector3& worldAabbMax, BP_FP_INT_TYPE handleMask, BP_FP_INT_TYPE handleSentinel, BP_FP_INT_TYPE userMaxHandles, cbtOverlappingPairCache* pairCache, bool disableRaycastAccelerator)
	: m_bpHandleMask(handleMask),
	  m_handleSentinel(handleSentinel),
	  m_pairCache(pairCache),
	  m_userPairCallback(0),
	  m_ownsPairCache(false),
	  m_invalidPair(0),
	  m_raycastAccelerator(0)
{
	BP_FP_INT_TYPE maxHandles = static_cast<BP_FP_INT_TYPE>(userMaxHandles + 1);  //need to add one sentinel handle

	if (!m_pairCache)
	{
		void* ptr = cbtAlignedAlloc(sizeof(cbtHashedOverlappingPairCache), 16);
		m_pairCache = new (ptr) cbtHashedOverlappingPairCache();
		m_ownsPairCache = true;
	}

	if (!disableRaycastAccelerator)
	{
		m_nullPairCache = new (cbtAlignedAlloc(sizeof(cbtNullPairCache), 16)) cbtNullPairCache();
		m_raycastAccelerator = new (cbtAlignedAlloc(sizeof(cbtDbvtBroadphase), 16)) cbtDbvtBroadphase(m_nullPairCache);  //m_pairCache);
		m_raycastAccelerator->m_deferedcollide = true;                                                                //don't add/remove pairs
	}

	//cbtAssert(bounds.HasVolume());

	// init bounds
	m_worldAabbMin = worldAabbMin;
	m_worldAabbMax = worldAabbMax;

	cbtVector3 aabbSize = m_worldAabbMax - m_worldAabbMin;

	BP_FP_INT_TYPE maxInt = m_handleSentinel;

	m_quantize = cbtVector3(cbtScalar(maxInt), cbtScalar(maxInt), cbtScalar(maxInt)) / aabbSize;

	// allocate handles buffer, using cbtAlignedAlloc, and put all handles on free list
	m_pHandles = new Handle[maxHandles];

	m_maxHandles = maxHandles;
	m_numHandles = 0;

	// handle 0 is reserved as the null index, and is also used as the sentinel
	m_firstFreeHandle = 1;
	{
		for (BP_FP_INT_TYPE i = m_firstFreeHandle; i < maxHandles; i++)
			m_pHandles[i].SetNextFree(static_cast<BP_FP_INT_TYPE>(i + 1));
		m_pHandles[maxHandles - 1].SetNextFree(0);
	}

	{
		// allocate edge buffers
		for (int i = 0; i < 3; i++)
		{
			m_pEdgesRawPtr[i] = cbtAlignedAlloc(sizeof(Edge) * maxHandles * 2, 16);
			m_pEdges[i] = new (m_pEdgesRawPtr[i]) Edge[maxHandles * 2];
		}
	}
	//removed overlap management

	// make boundary sentinels

	m_pHandles[0].m_clientObject = 0;

	for (int axis = 0; axis < 3; axis++)
	{
		m_pHandles[0].m_minEdges[axis] = 0;
		m_pHandles[0].m_maxEdges[axis] = 1;

		m_pEdges[axis][0].m_pos = 0;
		m_pEdges[axis][0].m_handle = 0;
		m_pEdges[axis][1].m_pos = m_handleSentinel;
		m_pEdges[axis][1].m_handle = 0;
#ifdef DEBUG_BROADPHASE
		debugPrintAxis(axis);
#endif  //DEBUG_BROADPHASE
	}
}